

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void add_pass_code(Grammar *g,Rule *r,char *pass_start,char *pass_end,char *code_start,
                  char *code_end,uint pass_line,uint code_line)

{
  anon_struct_40_4_d8687ec6_for_pass_code *v;
  uint uVar1;
  uint uVar2;
  Code **ppCVar3;
  Code **ppCVar4;
  D_Pass *pDVar5;
  char *pcVar6;
  Code *pCVar7;
  
  pDVar5 = find_pass(g,pass_start,pass_end);
  if (pDVar5 == (D_Pass *)0x0) {
    pcVar6 = dup_str(pass_start,pass_end);
    d_fail("unknown pass \'%s\' line %d",pcVar6,(ulong)pass_line);
  }
  v = &r->pass_code;
  ppCVar4 = (r->pass_code).e;
  do {
    while( true ) {
      while( true ) {
        uVar1 = v->n;
        uVar2 = pDVar5->index;
        if (uVar2 < uVar1) {
          pCVar7 = (Code *)malloc(0x10);
          (r->pass_code).v[uVar2] = pCVar7;
          pcVar6 = dup_str(code_start,code_end);
          ppCVar4 = (r->pass_code).v;
          uVar1 = pDVar5->index;
          ppCVar4[uVar1]->code = pcVar6;
          ppCVar4[uVar1]->line = code_line;
          return;
        }
        ppCVar3 = (r->pass_code).v;
        if (ppCVar3 != (Code **)0x0) break;
        (r->pass_code).v = ppCVar4;
        (r->pass_code).n = uVar1 + 1;
        (r->pass_code).e[uVar1] = (Code *)0x0;
      }
      if (ppCVar3 != ppCVar4) break;
      if (2 < uVar1) goto LAB_0013a55a;
LAB_0013a532:
      v->n = uVar1 + 1;
      ppCVar3[uVar1] = (Code *)0x0;
    }
    if ((uVar1 & 7) != 0) goto LAB_0013a532;
LAB_0013a55a:
    vec_add_internal(v,(void *)0x0);
  } while( true );
}

Assistant:

void add_pass_code(Grammar *g, Rule *r, char *pass_start, char *pass_end, char *code_start, char *code_end,
                   uint pass_line, uint code_line) {
  D_Pass *p = find_pass(g, pass_start, pass_end);
  if (!p) d_fail("unknown pass '%s' line %d", dup_str(pass_start, pass_end), pass_line);
  while (r->pass_code.n <= p->index) vec_add(&r->pass_code, NULL);
  r->pass_code.v[p->index] = MALLOC(sizeof(Code));
  r->pass_code.v[p->index]->code = dup_str(code_start, code_end);
  r->pass_code.v[p->index]->line = code_line;
}